

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
argstest::
MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
::ParseValue(MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_argstest::ValueReader,_argstest::detail::unordered_map>
             *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values_)

{
  const_iterator cVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  ostringstream problem;
  key_type local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if ((values_->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (values_->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_assign((string *)&local_1d0);
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->map)._M_h,&local_1d0);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Could not find key \'",0x14);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' in map for arg \'",0x12);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name.
                                 _M_dataplus._M_p,
                          (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name.
                          _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.error = Map;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.errorMsg,
                 (string *)local_1b0);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0]);
      }
      std::__cxx11::ostringstream::~ostringstream(local_190);
      std::ios_base::~ios_base(local_120);
    }
    else {
      this->value = *(MappingEnum *)
                     ((long)cVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
                            ._M_cur + 0x28);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value_ = values_.at(0);

                K key;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, key))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, key);
#endif
                auto it = map.find(key);
                if (it == std::end(map))
                {
                    std::ostringstream problem;
                    problem << "Could not find key '" << key << "' in map for arg '" << name << "'";
#ifdef ARGS_NOEXCEPT
                    error = Error::Map;
                    errorMsg = problem.str();
#else
                    throw MapError(problem.str());
#endif
                } else
                {
                    this->value = it->second;
                }
            }